

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_saveg.cpp
# Opt level: O1

void P_SerializeSubsectors(FArchive *arc)

{
  FArchive *pFVar1;
  long lVar2;
  byte *pbVar3;
  int iVar4;
  byte bVar5;
  long lVar6;
  long lVar7;
  BYTE by;
  int num_subs;
  int num_nodes;
  int num_verts;
  byte local_3d;
  DWORD local_3c;
  DWORD local_38;
  DWORD local_34;
  
  if (arc->m_Storing == true) {
    if (hasglnodes) {
      pFVar1 = FArchive::operator<<(arc,(DWORD *)&numvertexes);
      pFVar1 = FArchive::operator<<(pFVar1,(DWORD *)&numsubsectors);
      FArchive::operator<<(pFVar1,(DWORD *)&numnodes);
      if (0 < numsubsectors) {
        lVar6 = 0x2c;
        lVar7 = 0;
        do {
          local_3d = 0;
          pbVar3 = (byte *)((long)&((subsector_t *)(subsectors->portalcoverage + -4))->sector +
                           lVar6);
          lVar2 = 0;
          bVar5 = 0;
          do {
            if ((lVar2 + lVar7 < (long)numsubsectors) && ((*pbVar3 & 2) != 0)) {
              bVar5 = bVar5 | (byte)(1 << ((byte)lVar2 & 0x1f));
              local_3d = bVar5;
            }
            lVar2 = lVar2 + 1;
            pbVar3 = pbVar3 + 0x60;
          } while (lVar2 != 8);
          FArchive::operator<<(arc,&local_3d);
          lVar7 = lVar7 + 8;
          lVar6 = lVar6 + 0x300;
        } while ((int)lVar7 < numsubsectors);
      }
    }
    else {
      local_34 = 0;
      pFVar1 = FArchive::operator<<(arc,&local_34);
      pFVar1 = FArchive::operator<<(pFVar1,&local_34);
      FArchive::operator<<(pFVar1,&local_34);
    }
  }
  else {
    pFVar1 = FArchive::operator<<(arc,&local_34);
    pFVar1 = FArchive::operator<<(pFVar1,&local_3c);
    FArchive::operator<<(pFVar1,&local_38);
    if (((local_34 == numvertexes) && (local_3c == numsubsectors)) && (local_38 == numnodes)) {
      if (0 < numsubsectors) {
        lVar6 = 0x2c;
        lVar7 = 0;
        do {
          FArchive::operator<<(arc,&local_3d);
          pbVar3 = (byte *)((long)&((subsector_t *)(subsectors->portalcoverage + -4))->sector +
                           lVar6);
          lVar2 = 0;
          do {
            if (((local_3d >> ((uint)lVar2 & 0x1f) & 1) != 0) &&
               (lVar2 + lVar7 < (long)numsubsectors)) {
              *pbVar3 = *pbVar3 | 2;
            }
            lVar2 = lVar2 + 1;
            pbVar3 = pbVar3 + 0x60;
          } while (lVar2 != 8);
          lVar7 = lVar7 + 8;
          lVar6 = lVar6 + 0x300;
        } while ((int)lVar7 < numsubsectors);
      }
    }
    else {
      if (0 < (int)local_3c) {
        iVar4 = 0;
        do {
          FArchive::operator<<(arc,&local_3d);
          iVar4 = iVar4 + 8;
        } while (iVar4 < (int)local_3c);
      }
      if (hasglnodes != false) {
        RecalculateDrawnSubsectors();
      }
    }
  }
  return;
}

Assistant:

void P_SerializeSubsectors(FArchive &arc)
{
	int num_verts, num_subs, num_nodes;	
	BYTE by;

	if (arc.IsStoring())
	{
		if (hasglnodes)
		{
			arc << numvertexes << numsubsectors << numnodes;	// These are only for verification
			for(int i=0;i<numsubsectors;i+=8)
			{
				by = 0;
				for(int j=0;j<8;j++)
				{
					if (i+j<numsubsectors && (subsectors[i+j].flags & SSECF_DRAWN))
					{
						by |= (1<<j);
					}
				}
				arc << by;
			}
		}
		else
		{
			int v = 0;
			arc << v << v << v;
		}
	}
	else
	{
		arc << num_verts << num_subs << num_nodes;
		if (num_verts != numvertexes ||
			num_subs != numsubsectors ||
			num_nodes != numnodes)
		{
			// Nodes don't match - we can't use this info
			for(int i=0;i<num_subs;i+=8)
			{
				// Skip the subsector info.
				arc << by;
			}
			if (hasglnodes)
			{
				RecalculateDrawnSubsectors();
			}
			return;
		}
		else
		{
			for(int i=0;i<numsubsectors;i+=8)
			{
				arc << by;
				for(int j=0;j<8;j++)
				{
					if ((by & (1<<j)) && i+j<numsubsectors)
					{
						subsectors[i+j].flags |= SSECF_DRAWN;
					}
				}
			}
		}
	}
}